

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

char * __thiscall
Memory::Recycler::LargeAlloc<true>
          (Recycler *this,HeapInfo *heap,size_t size,ObjectInfoBits attributes)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ConfigFlagsTable *pCVar4;
  Recycler *local_40;
  char *addr;
  size_t limit;
  ObjectInfoBits attributes_local;
  size_t size_local;
  HeapInfo *heap_local;
  Recycler *this_local;
  
  if ((attributes & InternalObjectInfoBitMask) != attributes) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x54f,"((attributes & InternalObjectInfoBitMask) == attributes)",
                       "(attributes & InternalObjectInfoBitMask) == attributes");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pCVar4 = GetRecyclerFlagsTable(this);
  if (size < (ulong)((long)pCVar4->MaxSingleAllocSizeInMB << 0x14)) {
    local_40 = (Recycler *)TryLargeAlloc(this,heap,size,attributes,true);
    if (local_40 == (Recycler *)0x0) {
      CollectNow<(Memory::CollectionFlags)16384>(this);
      local_40 = (Recycler *)TryLargeAlloc(this,heap,size,attributes,true);
      if (local_40 == (Recycler *)0x0) {
        return (char *)0x0;
      }
    }
    (this->autoHeap).uncollectedAllocBytes = size + (this->autoHeap).uncollectedAllocBytes;
    this_local = local_40;
  }
  else {
    this_local = (Recycler *)0x0;
  }
  return (char *)this_local;
}

Assistant:

char*
Recycler::LargeAlloc(HeapInfo* heap, size_t size, ObjectInfoBits attributes)
{
    Assert((attributes & InternalObjectInfoBitMask) == attributes);

#if ENABLE_DEBUG_CONFIG_OPTIONS
    size_t limit = (size_t)GetRecyclerFlagsTable().MaxSingleAllocSizeInMB * 1024 * 1024;
#else
    size_t limit = (size_t)CONFIG_FLAG(MaxSingleAllocSizeInMB) * 1024 * 1024;
#endif

    if (size >= limit)
    {
        if (nothrow == false)
        {
#if ENABLE_DEBUG_CONFIG_OPTIONS
            if (GetRecyclerFlagsTable().EnableFatalErrorOnOOM)
            {
                if (this->IsMemProtectMode())
                {
                    MemGCSingleAllocationLimit_unrecoverable_error();
                }
                else
                {
                    RecyclerSingleAllocationLimit_unrecoverable_error();
                }
            }
#endif
            this->OutOfMemory();
        }
        else
        {
            return nullptr;
        }
    }

    char * addr = TryLargeAlloc(heap, size, attributes, nothrow);
    if (addr == nullptr)
    {
        // Force a collection and try to allocate again.
        this->CollectNow<CollectNowForceInThread>();
        addr = TryLargeAlloc(heap, size, attributes, nothrow);
        if (addr == nullptr)
        {
            if (nothrow == false)
            {
                // Still fails, we are out of memory
                // Since nothrow is false, it's okay to throw here
                this->OutOfMemory();
            }
            else
            {
                return nullptr;
            }
        }
    }
    autoHeap.uncollectedAllocBytes += size;
    return addr;
}